

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O2

void __thiscall SpiAnalyzer::~SpiAnalyzer(SpiAnalyzer *this)

{
  ~SpiAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

SpiAnalyzer::~SpiAnalyzer()
{
    KillThread();
}